

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QRectF * __thiscall
QPlainTextEditControl::blockBoundingRect(QPlainTextEditControl *this,QTextBlock *block)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  QPlainTextDocumentLayout *pQVar6;
  qreal *pqVar7;
  undefined8 in_RDX;
  long in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar8;
  qreal qVar9;
  int maxVerticalOffset;
  QPlainTextDocumentLayout *documentLayout;
  QTextDocument *doc;
  int blockNumber;
  int currentBlockNumber;
  QPointF offset;
  QTextBlock currentBlock;
  QPointF *in_stack_fffffffffffffea8;
  QRectF *in_stack_fffffffffffffeb0;
  int local_dc;
  qreal local_c8;
  qreal local_c0;
  qreal local_b8;
  qreal local_b0;
  qreal local_a8;
  qreal local_a0;
  qreal local_98;
  qreal local_90;
  qreal local_88;
  qreal local_80;
  qreal local_78;
  qreal local_70;
  QPointF local_68;
  QTextBlock local_58;
  QTextBlock local_48;
  QTextBlock local_38;
  QTextBlock local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_dc = *(int *)(in_RSI + 0x20);
  iVar3 = QTextBlock::blockNumber();
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffeb0);
  QTextDocument::findBlockByNumber((int)local_18);
  uVar5 = QTextBlock::isValid();
  if ((uVar5 & 1) == 0) {
    QRectF::QRectF(in_RDI);
  }
  else {
    QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffeb0);
    QTextDocument::documentLayout();
    pQVar6 = qobject_cast<QPlainTextDocumentLayout*>((QObject *)0x6c0948);
    local_68.xp = -NAN;
    local_68.yp = -NAN;
    QPointF::QPointF(&local_68);
    uVar5 = QTextBlock::isValid();
    if ((uVar5 & 1) == 0) {
      QRectF::QRectF(in_RDI);
    }
    else {
      in_RDI->xp = -NAN;
      in_RDI->yp = -NAN;
      in_RDI->w = -NAN;
      in_RDI->h = -NAN;
      (**(code **)(*(long *)pQVar6 + 0x88))(in_RDI,pQVar6,local_18);
      qVar8 = QRectF::height(in_RDI);
      while( true ) {
        bVar1 = false;
        if (local_dc < iVar3) {
          qVar9 = QPointF::y(&local_68);
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffeb0);
          iVar4 = QWidget::height((QWidget *)0x6c0a33);
          bVar1 = qVar9 - (double)(int)qVar8 <= (double)(iVar4 << 1);
        }
        if (!bVar1) break;
        qVar9 = QRectF::height(in_RDI);
        pqVar7 = QPointF::ry(&local_68);
        *pqVar7 = qVar9 + *pqVar7;
        QTextBlock::next();
        QTextBlock::operator=((QTextBlock *)local_18,&local_28);
        local_dc = local_dc + 1;
        uVar5 = QTextBlock::isVisible();
        if ((uVar5 & 1) == 0) {
          QTextBlock::firstLineNumber();
          QTextDocument::findBlockByLineNumber((int)&local_38);
          QTextBlock::operator=((QTextBlock *)local_18,&local_38);
          local_dc = QTextBlock::blockNumber();
        }
        (**(code **)(*(long *)pQVar6 + 0x88))(&local_88,pQVar6,local_18);
        in_RDI->xp = local_88;
        in_RDI->yp = local_80;
        in_RDI->w = local_78;
        in_RDI->h = local_70;
      }
      while( true ) {
        bVar1 = false;
        if (iVar3 < local_dc) {
          qVar9 = QPointF::y(&local_68);
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffeb0);
          iVar4 = QWidget::height((QWidget *)0x6c0bb5);
          bVar1 = (double)-iVar4 <= qVar9 + (double)(int)qVar8;
        }
        if (!bVar1) break;
        QTextBlock::previous();
        QTextBlock::operator=((QTextBlock *)local_18,&local_48);
        while( true ) {
          local_dc = local_dc + -1;
          bVar2 = QTextBlock::isVisible();
          if (((bVar2 ^ 0xff) & 1) == 0) break;
          QTextBlock::previous();
          QTextBlock::operator=((QTextBlock *)local_18,&local_58);
        }
        uVar5 = QTextBlock::isValid();
        if ((uVar5 & 1) == 0) break;
        (**(code **)(*(long *)pQVar6 + 0x88))(&local_a8,pQVar6,local_18);
        in_RDI->xp = local_a8;
        in_RDI->yp = local_a0;
        in_RDI->w = local_98;
        in_RDI->h = local_90;
        qVar9 = QRectF::height(in_RDI);
        pqVar7 = QPointF::ry(&local_68);
        *pqVar7 = *pqVar7 - qVar9;
      }
      if (local_dc != iVar3) {
        (**(code **)(*(long *)pQVar6 + 0x88))(&local_c8,pQVar6,in_RDX);
        in_RDI->xp = local_c8;
        in_RDI->yp = local_c0;
        in_RDI->w = local_b8;
        in_RDI->h = local_b0;
        if (iVar3 < local_dc) {
          in_stack_fffffffffffffeb0 = (QRectF *)QRectF::height(in_RDI);
          pqVar7 = QPointF::ry(&local_68);
          *pqVar7 = *pqVar7 - (double)in_stack_fffffffffffffeb0;
        }
      }
      QRectF::translate(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QPlainTextEditControl::blockBoundingRect(const QTextBlock &block) const {
    int currentBlockNumber = topBlock;
    int blockNumber = block.blockNumber();
    QTextBlock currentBlock = document()->findBlockByNumber(currentBlockNumber);
    if (!currentBlock.isValid())
        return QRectF();
    Q_ASSERT(currentBlock.blockNumber() == currentBlockNumber);
    QTextDocument *doc = document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(doc->documentLayout());
    Q_ASSERT(documentLayout);

    QPointF offset;
    if (!block.isValid())
        return QRectF();
    QRectF r = documentLayout->blockBoundingRect(currentBlock);
    int maxVerticalOffset = r.height();
    while (currentBlockNumber < blockNumber && offset.y() - maxVerticalOffset <= 2* textEdit->viewport()->height()) {
        offset.ry() += r.height();
        currentBlock = currentBlock.next();
        ++currentBlockNumber;
        if (!currentBlock.isVisible()) {
            currentBlock = doc->findBlockByLineNumber(currentBlock.firstLineNumber());
            currentBlockNumber = currentBlock.blockNumber();
        }
        r = documentLayout->blockBoundingRect(currentBlock);
    }
    while (currentBlockNumber > blockNumber && offset.y() + maxVerticalOffset >= -textEdit->viewport()->height()) {
        currentBlock = currentBlock.previous();
        --currentBlockNumber;
        while (!currentBlock.isVisible()) {
            currentBlock = currentBlock.previous();
            --currentBlockNumber;
        }
        if (!currentBlock.isValid())
            break;

        r = documentLayout->blockBoundingRect(currentBlock);
        offset.ry() -= r.height();
    }

    if (currentBlockNumber != blockNumber) {
        // fallback for blocks out of reach. Give it some geometry at
        // least, and ensure the layout is up to date.
        r = documentLayout->blockBoundingRect(block);
        if (currentBlockNumber > blockNumber)
            offset.ry() -= r.height();
    }
    r.translate(offset);
    return r;
}